

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

String __thiscall
testing::internal::StreamableToString<wchar_t*>(internal *this,wchar_t **streamable)

{
  size_t extraout_RDX;
  String SVar1;
  Message *this_00;
  Message local_20;
  wchar_t **local_18;
  wchar_t **streamable_local;
  
  this_00 = &local_20;
  local_18 = streamable;
  streamable_local = (wchar_t **)this;
  Message::Message(this_00);
  Message::operator<<(this_00,*local_18);
  Message::GetString((Message *)this);
  Message::~Message((Message *)0x1633e6);
  SVar1.length_ = extraout_RDX;
  SVar1.c_str_ = (char *)this;
  return SVar1;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}